

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O1

unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> __thiscall
acto::core::object_t::select_message(object_t *this)

{
  __pointer_type pmVar1;
  __pointer_type pmVar2;
  msg_t *pmVar3;
  __pointer_type pmVar4;
  __uniq_ptr_data<acto::core::msg_t,_std::default_delete<acto::core::msg_t>,_true,_true> in_RDI;
  bool bVar5;
  
  pmVar3 = (this->local_stack).head_;
  if (pmVar3 == (msg_t *)0x0) {
    do {
      pmVar2 = (this->input_stack).head_._M_b._M_p;
      pmVar1 = (__pointer_type)0x0;
      if (pmVar2 == (__pointer_type)0x0) break;
      LOCK();
      pmVar1 = (this->input_stack).head_._M_b._M_p;
      bVar5 = pmVar2 == pmVar1;
      if (bVar5) {
        (this->input_stack).head_._M_b._M_p = (__pointer_type)0x0;
        pmVar1 = pmVar2;
      }
      UNLOCK();
    } while (!bVar5);
    if (pmVar1 != (__pointer_type)0x0) {
      pmVar2 = (this->local_stack).head_;
      do {
        pmVar4 = pmVar1;
        pmVar1 = (pmVar4->super_node<acto::core::msg_t>).next;
        (pmVar4->super_node<acto::core::msg_t>).next = pmVar2;
        pmVar2 = pmVar4;
      } while (pmVar1 != (msg_t *)0x0);
      (this->local_stack).head_ = pmVar4;
    }
    pmVar3 = (this->local_stack).head_;
    if (pmVar3 == (msg_t *)0x0) goto LAB_001059c0;
  }
  (this->local_stack).head_ = (pmVar3->super_node<acto::core::msg_t>).next;
  (pmVar3->super_node<acto::core::msg_t>).next = (msg_t *)0x0;
LAB_001059c0:
  *(msg_t **)
   in_RDI.super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>._M_t.
   super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
   super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl = pmVar3;
  return (__uniq_ptr_data<acto::core::msg_t,_std::default_delete<acto::core::msg_t>,_true,_true>)
         (tuple<acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>)
         in_RDI.super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>.
         _M_t.super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
         super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl;
}

Assistant:

constexpr T* pop() noexcept {
    T* result = head_;

    if (result) {
      head_ = result->next;
      result->next = nullptr;
    }
    return result;
  }